

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupSelf(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iLit1;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_2c;
  int iCtrl;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  iVar1 = Gia_ManAppendCi(p_00);
  local_2c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if (local_2c < iVar2) {
      _iCtrl = Gia_ManCi(p,local_2c);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ManAppendCi(p_00);
    _iCtrl->Value = uVar3;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    bVar7 = false;
    if (local_2c < p->nObjs) {
      _iCtrl = Gia_ManObj(p,local_2c);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjIsAnd(_iCtrl);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjFanin0Copy(_iCtrl);
      iLit1 = Gia_ObjFanin1Copy(_iCtrl);
      uVar3 = Gia_ManHashAnd(p_00,iVar2,iLit1);
      _iCtrl->Value = uVar3;
    }
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar2 = Gia_ManPoNum(p);
    bVar7 = false;
    if (local_2c < iVar2) {
      _iCtrl = Gia_ManCo(p,local_2c);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ObjFanin0Copy(_iCtrl);
    _iCtrl->Value = uVar3;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p);
    bVar7 = false;
    if (local_2c < iVar2) {
      iVar2 = Gia_ManPoNum(p);
      _iCtrl = Gia_ManCo(p,iVar2 + local_2c);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjFanin0Copy(_iCtrl);
    pGVar5 = Gia_ObjRiToRo(p,_iCtrl);
    uVar3 = Gia_ManHashMux(p_00,iVar1,iVar2,pGVar5->Value);
    _iCtrl->Value = uVar3;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if (local_2c < iVar1) {
      _iCtrl = Gia_ManCo(p,local_2c);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    Gia_ManAppendCo(p_00,_iCtrl->Value);
    local_2c = local_2c + 1;
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupSelf( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp; 
    Gia_Obj_t * pObj;
    int i, iCtrl;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    iCtrl = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManHashMux( pNew, iCtrl, Gia_ObjFanin0Copy(pObj), Gia_ObjRiToRo(p, pObj)->Value );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}